

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qgraphicstransform.cpp
# Opt level: O1

int __thiscall QGraphicsTransform::qt_metacall(QGraphicsTransform *this,Call _c,int _id,void **_a)

{
  undefined1 *puVar1;
  QGraphicsItem *this_00;
  int iVar2;
  undefined4 in_register_00000014;
  
  iVar2 = QObject::qt_metacall((Call)this,_c,(void **)CONCAT44(in_register_00000014,_id));
  if (-1 < iVar2) {
    if (_c == InvokeMetaMethod) {
      if ((iVar2 == 0) &&
         (this_00 = *(QGraphicsItem **)(*(long *)(this + 8) + 0x78), this_00 != (QGraphicsItem *)0x0
         )) {
        QGraphicsItem::prepareGeometryChange(this_00);
        puVar1 = &((this_00->d_ptr).d)->field_0x160;
        *(ulong *)puVar1 = *(ulong *)puVar1 | 0x20000000000000;
      }
      iVar2 = iVar2 + -1;
    }
    if (_c == RegisterMethodArgumentMetaType) {
      if (iVar2 < 1) {
        *(undefined8 *)*_a = 0;
      }
      iVar2 = iVar2 + -1;
    }
  }
  return iVar2;
}

Assistant:

int QGraphicsTransform::qt_metacall(QMetaObject::Call _c, int _id, void **_a)
{
    _id = QObject::qt_metacall(_c, _id, _a);
    if (_id < 0)
        return _id;
    if (_c == QMetaObject::InvokeMetaMethod) {
        if (_id < 1)
            qt_static_metacall(this, _c, _id, _a);
        _id -= 1;
    }
    if (_c == QMetaObject::RegisterMethodArgumentMetaType) {
        if (_id < 1)
            *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType();
        _id -= 1;
    }
    return _id;
}